

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_transaction.cpp
# Opt level: O0

void __thiscall
cfdcapi_transaction_FundRawTransaction_Check2_Test::TestBody
          (cfdcapi_transaction_FundRawTransaction_Check2_Test *this)

{
  initializer_list<CfdTestFundElementsUtxoVector> __l;
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  char *pcVar4;
  char *in_R9;
  AssertionResult gtest_ar_15;
  AssertionResult gtest_ar_14;
  CfdException *except;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  char *str_buffer;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  double effective_fee_rate;
  char *output_tx_hex;
  uint32_t append_txout_count;
  int64_t tx_fee_amount;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  CfdTestFundElementsUtxoVector *test_data;
  const_iterator __end2;
  const_iterator __begin2;
  vector<CfdTestFundElementsUtxoVector,_std::allocator<CfdTestFundElementsUtxoVector>_> *__range2;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  void *fund_handle;
  string fee_asset;
  uint32_t target_asset_count;
  char *tx;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int ret;
  void *handle;
  vector<CfdTestFundElementsUtxoVector,_std::allocator<CfdTestFundElementsUtxoVector>_>
  *in_stack_fffffffffffff918;
  CfdTestFundElementsUtxoVector *in_stack_fffffffffffff920;
  void **in_stack_fffffffffffff928;
  AssertionResult *pAVar5;
  undefined7 in_stack_fffffffffffff930;
  undefined1 in_stack_fffffffffffff937;
  undefined4 in_stack_fffffffffffff938;
  uint32_t in_stack_fffffffffffff93c;
  char *in_stack_fffffffffffff940;
  allocator_type *in_stack_fffffffffffff948;
  undefined4 in_stack_fffffffffffff950;
  undefined4 in_stack_fffffffffffff954;
  void *in_stack_fffffffffffff958;
  undefined7 in_stack_fffffffffffff960;
  undefined1 in_stack_fffffffffffff967;
  char **in_stack_fffffffffffff9b0;
  undefined4 in_stack_fffffffffffff9b8;
  undefined8 in_stack_fffffffffffff9e0;
  undefined1 bool_value;
  undefined4 in_stack_fffffffffffff9e8;
  void *in_stack_fffffffffffff9f0;
  void *in_stack_fffffffffffff9f8;
  char *in_stack_fffffffffffffa00;
  undefined7 in_stack_fffffffffffffa08;
  undefined1 in_stack_fffffffffffffa0f;
  undefined4 uVar6;
  undefined7 in_stack_fffffffffffffa80;
  char *in_stack_fffffffffffffa88;
  uint32_t asset_index;
  void *in_stack_fffffffffffffa90;
  void *in_stack_fffffffffffffa98;
  string *local_520;
  AssertHelper local_4b0;
  Message local_4a8;
  undefined4 local_49c;
  AssertionResult local_498 [3];
  AssertHelper local_460;
  Message local_458;
  undefined4 local_44c;
  AssertionResult local_448;
  AssertHelper local_438;
  Message local_430;
  AssertionResult local_428;
  AssertHelper local_418;
  Message local_410;
  undefined4 local_404;
  AssertionResult local_400;
  char *local_3f0;
  AssertHelper local_3e8;
  Message local_3e0;
  AssertionResult local_3d8;
  AssertHelper local_3c8;
  Message local_3c0;
  undefined4 local_3b4;
  AssertionResult local_3b0;
  AssertHelper local_3a0;
  Message local_398;
  undefined4 local_38c;
  AssertionResult local_388;
  AssertHelper local_378;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffc90;
  undefined4 in_stack_fffffffffffffc98;
  undefined4 in_stack_fffffffffffffc9c;
  uint32_t in_stack_fffffffffffffca0;
  int in_stack_fffffffffffffca4;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffca8;
  AssertHelper local_330;
  Message local_328;
  undefined4 local_31c;
  AssertionResult local_318;
  AssertHelper local_308;
  Message local_300;
  undefined4 local_2f4;
  AssertionResult local_2f0;
  AssertHelper local_2e0;
  Message local_2d8;
  undefined4 local_2cc;
  AssertionResult local_2c8;
  string local_2b8;
  AssertHelper local_298;
  Message local_290;
  undefined4 local_284;
  AssertionResult local_280;
  reference local_270;
  CfdTestFundElementsUtxoVector *local_268;
  __normal_iterator<const_CfdTestFundElementsUtxoVector_*,_std::vector<CfdTestFundElementsUtxoVector,_std::allocator<CfdTestFundElementsUtxoVector>_>_>
  local_260;
  vector<CfdTestFundElementsUtxoVector,_std::allocator<CfdTestFundElementsUtxoVector>_> *local_258;
  AssertHelper local_250;
  Message local_248;
  undefined8 local_240;
  AssertionResult local_238;
  AssertHelper local_228;
  Message local_220;
  undefined4 in_stack_fffffffffffffde8;
  undefined4 uVar7;
  uint32_t *in_stack_fffffffffffffdf0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffdf8;
  void *pvVar8;
  char *in_stack_fffffffffffffe08;
  void *in_stack_fffffffffffffe10;
  undefined8 in_stack_fffffffffffffe18;
  string local_1c8;
  AssertHelper local_1a8;
  Message local_1a0;
  undefined1 local_191;
  AssertionResult local_190;
  AssertHelper local_180;
  Message local_178;
  undefined4 local_16c;
  AssertionResult local_168;
  int local_154;
  void *local_150;
  allocator local_143 [2];
  undefined1 local_141;
  undefined1 local_140;
  undefined1 local_13f;
  allocator local_13e;
  allocator local_13d;
  undefined1 local_13c;
  undefined1 local_13b;
  allocator local_13a;
  allocator local_139;
  string *local_138;
  string local_130 [32];
  undefined4 local_110;
  undefined8 local_108;
  string local_100;
  string local_e0 [32];
  string local_c0 [32];
  undefined4 local_a0;
  undefined8 local_98;
  string sStack_90;
  string asStack_70 [32];
  string *local_50;
  undefined8 local_48;
  allocator local_29;
  string local_28;
  
  if ((TestBody()::exp_dummy_asset_a == '\0') &&
     (iVar3 = __cxa_guard_acquire(&TestBody()::exp_dummy_asset_a), iVar3 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_28,
               "5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225",&local_29);
    cfd::core::ConfidentialAssetId::ConfidentialAssetId(&TestBody::exp_dummy_asset_a,&local_28);
    std::__cxx11::string::~string((string *)&local_28);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
    __cxa_atexit(cfd::core::ConfidentialAssetId::~ConfidentialAssetId,&TestBody::exp_dummy_asset_a,
                 &__dso_handle);
    __cxa_guard_release(&TestBody()::exp_dummy_asset_a);
  }
  if ((TestBody()::kFundCoinSelectElementsTestVector3 == '\0') &&
     (iVar3 = __cxa_guard_acquire(&TestBody()::kFundCoinSelectElementsTestVector3), iVar3 != 0)) {
    local_141 = 1;
    local_138 = local_130;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_130,"2bc630021e76ab6bd7f8da54b0c59381e0265b093629e4384207030adba99775",
               &local_139);
    local_13c = 1;
    local_110 = 0;
    local_108 = 150000000;
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_100,&TestBody::exp_dummy_asset_a);
    local_13b = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_e0,
               "sh(wpkh([b8f7f84b/0\'/0\'/4\']029b382de02d1753b04f29e743ec988a7585e16f023d7c76fcb468133781465282))#jm9lh5q5"
               ,&local_13a);
    local_13b = 0;
    local_13c = 0;
    local_138 = local_c0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_c0,"42120c9e8adc1d0f0d843617a0c91d699a1eb67fb744dde21103d6423fa5c8c5",
               &local_13d);
    local_140 = 1;
    local_a0 = 1;
    local_98 = 150000000;
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&sStack_90,&TestBody::exp_dummy_asset_a);
    local_13f = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (asStack_70,
               "sh(wpkh([b8f7f84b/0\'/0\'/4\']029b382de02d1753b04f29e743ec988a7585e16f023d7c76fcb468133781465282))#jm9lh5q5"
               ,&local_13e);
    local_13f = 0;
    local_140 = 0;
    local_141 = 0;
    local_50 = local_130;
    local_48 = 2;
    std::allocator<CfdTestFundElementsUtxoVector>::allocator
              ((allocator<CfdTestFundElementsUtxoVector> *)0x3d9d0e);
    __l._M_len._0_7_ = in_stack_fffffffffffff960;
    __l._M_array = (iterator)in_stack_fffffffffffff958;
    __l._M_len._7_1_ = in_stack_fffffffffffff967;
    std::vector<CfdTestFundElementsUtxoVector,_std::allocator<CfdTestFundElementsUtxoVector>_>::
    vector((vector<CfdTestFundElementsUtxoVector,_std::allocator<CfdTestFundElementsUtxoVector>_> *)
           CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),__l,
           in_stack_fffffffffffff948);
    std::allocator<CfdTestFundElementsUtxoVector>::~allocator
              ((allocator<CfdTestFundElementsUtxoVector> *)0x3d9d41);
    local_520 = (string *)&local_50;
    do {
      local_520 = local_520 + -0x70;
      TestBody::CfdTestFundElementsUtxoVector::~CfdTestFundElementsUtxoVector
                (in_stack_fffffffffffff920);
    } while (local_520 != local_130);
    std::allocator<char>::~allocator((allocator<char> *)&local_13e);
    std::allocator<char>::~allocator((allocator<char> *)&local_13d);
    std::allocator<char>::~allocator((allocator<char> *)&local_13a);
    std::allocator<char>::~allocator((allocator<char> *)&local_139);
    __cxa_atexit(std::
                 vector<CfdTestFundElementsUtxoVector,_std::allocator<CfdTestFundElementsUtxoVector>_>
                 ::~vector,&TestBody::kFundCoinSelectElementsTestVector3,&__dso_handle);
    __cxa_guard_release(&TestBody()::kFundCoinSelectElementsTestVector3);
  }
  if ((TestBody()::kExpTxData_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&TestBody()::kExpTxData_abi_cxx11_), iVar3 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&TestBody()::kExpTxData_abi_cxx11_,
               "0200000000027597a9db0a03074238e42936095b26e08193c5b054daf8d76bab761e0230c62b0000000000ffffffffc5c8a53f42d60311e2dd44b77fb61e9a691dc9a01736840d0f1ddc8a9e0c12420100000000ffffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000005f5e100036a2e218bb512a3e65c80b59fec57aee428b7512276bcfa366c154dd7262994c817a914363273e2f851bda01e24cda41ba748b8d1f54cfe870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000007be00000125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000000bebba420230646d493a7ed8cb0091ad6e8feedcc9cd17a9162e61b7cff7929697792ef64217a91497dfc3937ad66e142925a76489eebc75358bca338700000000"
               ,local_143);
    std::allocator<char>::~allocator((allocator<char> *)local_143);
    __cxa_atexit(std::__cxx11::string::~string,&TestBody()::kExpTxData_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&TestBody()::kExpTxData_abi_cxx11_);
  }
  CfdInitialize();
  local_150 = (void *)0x0;
  local_154 = CfdCreateHandle((void **)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938)
                             );
  local_16c = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938),
             (char *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930),
             (CfdErrorCode *)in_stack_fffffffffffff928,(int *)in_stack_fffffffffffff920);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_168);
  if (!bVar1) {
    testing::Message::Message(&local_178);
    in_stack_fffffffffffffa88 =
         testing::AssertionResult::failure_message((AssertionResult *)0x3da1d4);
    testing::internal::AssertHelper::AssertHelper
              (&local_180,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x77a,in_stack_fffffffffffffa88);
    testing::internal::AssertHelper::operator=(&local_180,&local_178);
    testing::internal::AssertHelper::~AssertHelper(&local_180);
    testing::Message::~Message((Message *)0x3da237);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3da28c);
  local_191 = local_150 != (void *)0x0;
  pAVar5 = &local_190;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffff920,(bool *)in_stack_fffffffffffff918,
             (type *)0x3da2c0);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(pAVar5);
  if (!(bool)uVar2) {
    testing::Message::Message(&local_1a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1c8,(internal *)&local_190,(AssertionResult *)"(NULL == handle)","true",
               "false",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x77b,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1a8,&local_1a0);
    testing::internal::AssertHelper::~AssertHelper(&local_1a8);
    std::__cxx11::string::~string((string *)&local_1c8);
    testing::Message::~Message((Message *)0x3da3bc);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3da437);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_
            ((string *)&stack0xfffffffffffffe08,&TestBody::exp_dummy_asset_a);
  pvVar8 = (void *)0x0;
  uVar6 = 1;
  std::__cxx11::string::c_str();
  iVar3 = CfdInitializeFundRawTx
                    (in_stack_fffffffffffffca8.ptr_,in_stack_fffffffffffffca4,
                     in_stack_fffffffffffffca0,
                     (char *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                     (void **)in_stack_fffffffffffffc90.ptr_);
  uVar7 = 0;
  local_154 = iVar3;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938),
             (char *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930),
             (CfdErrorCode *)in_stack_fffffffffffff928,(int *)in_stack_fffffffffffff920);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffdf0);
  if (!bVar1) {
    testing::Message::Message(&local_220);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3da5b2);
    testing::internal::AssertHelper::AssertHelper
              (&local_228,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x785,pcVar4);
    testing::internal::AssertHelper::operator=(&local_228,&local_220);
    testing::internal::AssertHelper::~AssertHelper(&local_228);
    testing::Message::~Message((Message *)0x3da615);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3da66a);
  local_240 = 0;
  testing::internal::CmpHelperNE<decltype(nullptr),void*>
            ((char *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938),
             (char *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930),
             in_stack_fffffffffffff928,(void **)in_stack_fffffffffffff920);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_238);
  if (!bVar1) {
    testing::Message::Message(&local_248);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3da712);
    testing::internal::AssertHelper::AssertHelper
              (&local_250,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x786,pcVar4);
    testing::internal::AssertHelper::operator=(&local_250,&local_248);
    testing::internal::AssertHelper::~AssertHelper(&local_250);
    testing::Message::~Message((Message *)0x3da775);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3da7cd);
  if (local_154 == 0) {
    local_258 = &TestBody::kFundCoinSelectElementsTestVector3;
    local_260._M_current =
         (CfdTestFundElementsUtxoVector *)
         std::vector<CfdTestFundElementsUtxoVector,_std::allocator<CfdTestFundElementsUtxoVector>_>
         ::begin(in_stack_fffffffffffff918);
    local_268 = (CfdTestFundElementsUtxoVector *)
                std::
                vector<CfdTestFundElementsUtxoVector,_std::allocator<CfdTestFundElementsUtxoVector>_>
                ::end(in_stack_fffffffffffff918);
    in_stack_fffffffffffff9f8 = pvVar8;
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_CfdTestFundElementsUtxoVector_*,_std::vector<CfdTestFundElementsUtxoVector,_std::allocator<CfdTestFundElementsUtxoVector>_>_>
                          *)in_stack_fffffffffffff920,
                         (__normal_iterator<const_CfdTestFundElementsUtxoVector_*,_std::vector<CfdTestFundElementsUtxoVector,_std::allocator<CfdTestFundElementsUtxoVector>_>_>
                          *)in_stack_fffffffffffff918);
      bool_value = (undefined1)((ulong)in_stack_fffffffffffff9e0 >> 0x38);
      asset_index = (uint32_t)((ulong)in_stack_fffffffffffffa88 >> 0x20);
      if (!bVar1) break;
      local_270 = __gnu_cxx::
                  __normal_iterator<const_CfdTestFundElementsUtxoVector_*,_std::vector<CfdTestFundElementsUtxoVector,_std::allocator<CfdTestFundElementsUtxoVector>_>_>
                  ::operator*(&local_260);
      std::__cxx11::string::c_str();
      std::__cxx11::string::c_str();
      in_stack_fffffffffffff918 =
           (vector<CfdTestFundElementsUtxoVector,_std::allocator<CfdTestFundElementsUtxoVector>_> *)
           std::__cxx11::string::c_str();
      local_154 = CfdAddUtxoForFundRawTx
                            ((void *)CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                             in_stack_fffffffffffff948,in_stack_fffffffffffff940,
                             in_stack_fffffffffffff93c,
                             CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930),
                             (char *)in_stack_fffffffffffff928,
                             (char *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960));
      local_284 = 0;
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                ((char *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938),
                 (char *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930),
                 (CfdErrorCode *)in_stack_fffffffffffff928,(int *)in_stack_fffffffffffff920);
      in_stack_fffffffffffffa0f = testing::AssertionResult::operator_cast_to_bool(&local_280);
      if (!(bool)in_stack_fffffffffffffa0f) {
        testing::Message::Message(&local_290);
        in_stack_fffffffffffffa00 =
             testing::AssertionResult::failure_message((AssertionResult *)0x3da9b5);
        testing::internal::AssertHelper::AssertHelper
                  (&local_298,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                   ,0x78f,in_stack_fffffffffffffa00);
        testing::internal::AssertHelper::operator=(&local_298,&local_290);
        testing::internal::AssertHelper::~AssertHelper(&local_298);
        testing::Message::~Message((Message *)0x3daa18);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3daa6d);
      __gnu_cxx::
      __normal_iterator<const_CfdTestFundElementsUtxoVector_*,_std::vector<CfdTestFundElementsUtxoVector,_std::allocator<CfdTestFundElementsUtxoVector>_>_>
      ::operator++(&local_260);
    }
    in_stack_fffffffffffff9f0 = local_150;
    pvVar8 = in_stack_fffffffffffff9f8;
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_2b8,&TestBody::exp_dummy_asset_a);
    std::__cxx11::string::c_str();
    iVar3 = CfdAddTargetAmountForFundRawTx
                      (in_stack_fffffffffffffa98,in_stack_fffffffffffffa90,asset_index,
                       CONCAT17(uVar2,in_stack_fffffffffffffa80),&pAVar5->success_,
                       (char *)CONCAT44(iVar3,uVar6));
    local_154 = iVar3;
    std::__cxx11::string::~string((string *)&local_2b8);
    local_2cc = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938),
               (char *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930),
               (CfdErrorCode *)in_stack_fffffffffffff928,(int *)in_stack_fffffffffffff920);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2c8);
    uVar6 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff9e8);
    if (!bVar1) {
      testing::Message::Message(&local_2d8);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3dabd9);
      testing::internal::AssertHelper::AssertHelper
                (&local_2e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x795,pcVar4);
      bool_value = (undefined1)((ulong)pcVar4 >> 0x38);
      testing::internal::AssertHelper::operator=(&local_2e0,&local_2d8);
      testing::internal::AssertHelper::~AssertHelper(&local_2e0);
      testing::Message::~Message((Message *)0x3dac3c);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3dac94);
    local_154 = CfdSetOptionFundRawTx
                          ((void *)CONCAT17(in_stack_fffffffffffffa0f,in_stack_fffffffffffffa08),
                           in_stack_fffffffffffffa00,(int)((ulong)in_stack_fffffffffffff9f8 >> 0x20)
                           ,(int64_t)in_stack_fffffffffffff9f0,(double)CONCAT44(iVar3,uVar6),
                           (bool)bool_value);
    local_2f4 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938),
               (char *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930),
               (CfdErrorCode *)in_stack_fffffffffffff928,(int *)in_stack_fffffffffffff920);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2f0);
    if (!bVar1) {
      testing::Message::Message(&local_300);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3dad77);
      testing::internal::AssertHelper::AssertHelper
                (&local_308,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x799,pcVar4);
      testing::internal::AssertHelper::operator=(&local_308,&local_300);
      testing::internal::AssertHelper::~AssertHelper(&local_308);
      testing::Message::~Message((Message *)0x3dadda);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3dae32);
    local_154 = CfdSetOptionFundRawTx
                          ((void *)CONCAT17(in_stack_fffffffffffffa0f,in_stack_fffffffffffffa08),
                           in_stack_fffffffffffffa00,(int)((ulong)in_stack_fffffffffffff9f8 >> 0x20)
                           ,(int64_t)in_stack_fffffffffffff9f0,(double)CONCAT44(iVar3,uVar6),
                           (bool)bool_value);
    local_31c = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938),
               (char *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930),
               (CfdErrorCode *)in_stack_fffffffffffff928,(int *)in_stack_fffffffffffff920);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_318);
    if (!bVar1) {
      testing::Message::Message(&local_328);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3daf15);
      testing::internal::AssertHelper::AssertHelper
                (&local_330,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x79c,pcVar4);
      testing::internal::AssertHelper::operator=(&local_330,&local_328);
      testing::internal::AssertHelper::~AssertHelper(&local_330);
      testing::Message::~Message((Message *)0x3daf78);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3dafd0);
    iVar3 = CfdFinalizeFundRawTx
                      ((void *)in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                       in_stack_fffffffffffffe08,(double)pvVar8,
                       (int64_t *)in_stack_fffffffffffffdf8.ptr_,in_stack_fffffffffffffdf0,
                       (char **)CONCAT44(uVar7,in_stack_fffffffffffffde8));
    local_154 = iVar3;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938),
               (char *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930),
               (CfdErrorCode *)in_stack_fffffffffffff928,(int *)in_stack_fffffffffffff920);
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xfffffffffffffca0);
    uVar6 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff9b8);
    if (!bVar1) {
      testing::Message::Message((Message *)&stack0xfffffffffffffc90);
      in_stack_fffffffffffff9b0 =
           (char **)testing::AssertionResult::failure_message((AssertionResult *)0x3db101);
      testing::internal::AssertHelper::AssertHelper
                (&local_378,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x7a5,(char *)in_stack_fffffffffffff9b0);
      testing::internal::AssertHelper::operator=(&local_378,(Message *)&stack0xfffffffffffffc90);
      testing::internal::AssertHelper::~AssertHelper(&local_378);
      testing::Message::~Message((Message *)0x3db164);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3db1b9);
    if (local_154 == 0) {
      local_38c = 0x7be;
      testing::internal::EqHelper<false>::Compare<int,long>
                ((char *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938),
                 (char *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930),
                 (int *)in_stack_fffffffffffff928,(long *)in_stack_fffffffffffff920);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_388);
      if (!bVar1) {
        testing::Message::Message(&local_398);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3db26e);
        testing::internal::AssertHelper::AssertHelper
                  (&local_3a0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                   ,0x7a7,pcVar4);
        testing::internal::AssertHelper::operator=(&local_3a0,&local_398);
        testing::internal::AssertHelper::~AssertHelper(&local_3a0);
        testing::Message::~Message((Message *)0x3db2d1);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3db326);
      local_3b4 = 1;
      testing::internal::EqHelper<false>::Compare<int,unsigned_int>
                ((char *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938),
                 (char *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930),
                 (int *)in_stack_fffffffffffff928,(uint *)in_stack_fffffffffffff920);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3b0);
      if (!bVar1) {
        testing::Message::Message(&local_3c0);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3db3cd);
        testing::internal::AssertHelper::AssertHelper
                  (&local_3c8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                   ,0x7a9,pcVar4);
        testing::internal::AssertHelper::operator=(&local_3c8,&local_3c0);
        testing::internal::AssertHelper::~AssertHelper(&local_3c8);
        testing::Message::~Message((Message *)0x3db42a);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3db47f);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_3d8,"kExpTxData.c_str()","output_tx_hex",pcVar4,(char *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3d8);
      if (!bVar1) {
        testing::Message::Message(&local_3e0);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3db51c);
        testing::internal::AssertHelper::AssertHelper
                  (&local_3e8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                   ,0x7aa,pcVar4);
        testing::internal::AssertHelper::operator=(&local_3e8,&local_3e0);
        testing::internal::AssertHelper::~AssertHelper(&local_3e8);
        testing::Message::~Message((Message *)0x3db579);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3db5ce);
      CfdFreeStringBuffer((char *)in_stack_fffffffffffff928);
    }
    else {
      local_154 = CfdGetLastErrorCode(in_stack_fffffffffffff958);
      if (local_154 != 0) {
        local_3f0 = (char *)0x0;
        local_154 = CfdGetLastErrorMessage((void *)CONCAT44(iVar3,uVar6),in_stack_fffffffffffff9b0);
        local_404 = 0;
        testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                  ((char *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938),
                   (char *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930),
                   (CfdErrorCode *)in_stack_fffffffffffff928,(int *)in_stack_fffffffffffff920);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_400);
        if (!bVar1) {
          testing::Message::Message(&local_410);
          pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3db6e1);
          testing::internal::AssertHelper::AssertHelper
                    (&local_418,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                     ,0x7b1,pcVar4);
          testing::internal::AssertHelper::operator=(&local_418,&local_410);
          testing::internal::AssertHelper::~AssertHelper(&local_418);
          testing::Message::~Message((Message *)0x3db73e);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x3db793);
        testing::internal::CmpHelperSTREQ((internal *)&local_428,"\"\"","str_buffer","",local_3f0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_428);
        if (!bVar1) {
          testing::Message::Message(&local_430);
          pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3db828);
          testing::internal::AssertHelper::AssertHelper
                    (&local_438,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                     ,0x7b2,pcVar4);
          testing::internal::AssertHelper::operator=(&local_438,&local_430);
          testing::internal::AssertHelper::~AssertHelper(&local_438);
          testing::Message::~Message((Message *)0x3db885);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x3db8da);
        CfdFreeStringBuffer((char *)in_stack_fffffffffffff928);
        local_3f0 = (char *)0x0;
      }
    }
  }
  local_154 = CfdFreeFundRawTxHandle(in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0);
  local_44c = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938),
             (char *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930),
             (CfdErrorCode *)in_stack_fffffffffffff928,(int *)in_stack_fffffffffffff920);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_448);
  if (!bVar1) {
    testing::Message::Message(&local_458);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3db9c2);
    testing::internal::AssertHelper::AssertHelper
              (&local_460,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x7b9,pcVar4);
    testing::internal::AssertHelper::operator=(&local_460,&local_458);
    testing::internal::AssertHelper::~AssertHelper(&local_460);
    testing::Message::~Message((Message *)0x3dba1f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3dba74);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe08);
  local_154 = CfdFreeHandle(in_stack_fffffffffffff928);
  local_49c = 0;
  pAVar5 = local_498;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938),
             (char *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930),
             (CfdErrorCode *)pAVar5,(int *)in_stack_fffffffffffff920);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar5);
  if (!bVar1) {
    testing::Message::Message(&local_4a8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3dbce7);
    testing::internal::AssertHelper::AssertHelper
              (&local_4b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x7c1,pcVar4);
    testing::internal::AssertHelper::operator=(&local_4b0,&local_4a8);
    testing::internal::AssertHelper::~AssertHelper(&local_4b0);
    testing::Message::~Message((Message *)0x3dbd44);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3dbd99);
  return;
}

Assistant:

TEST(cfdcapi_transaction, FundRawTransaction_Check2) {
  // from cfd-go
  struct CfdTestFundElementsUtxoVector {
    std::string txid;
    uint32_t vout;
    int64_t amount;
    std::string asset;
    std::string descriptor;
  };
  static ConfidentialAssetId exp_dummy_asset_a("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225");

  static const std::vector<CfdTestFundElementsUtxoVector> kFundCoinSelectElementsTestVector3 = {
    {
      "2bc630021e76ab6bd7f8da54b0c59381e0265b093629e4384207030adba99775",
      0,
      150000000,
      exp_dummy_asset_a.GetHex(),
      "sh(wpkh([b8f7f84b/0'/0'/4']029b382de02d1753b04f29e743ec988a7585e16f023d7c76fcb468133781465282))#jm9lh5q5",
    },
    {
      "42120c9e8adc1d0f0d843617a0c91d699a1eb67fb744dde21103d6423fa5c8c5",
      1,
      150000000,
      exp_dummy_asset_a.GetHex(),
      "sh(wpkh([b8f7f84b/0'/0'/4']029b382de02d1753b04f29e743ec988a7585e16f023d7c76fcb468133781465282))#jm9lh5q5",
    },
  };
  static const std::string kExpTxData = "0200000000027597a9db0a03074238e42936095b26e08193c5b054daf8d76bab761e0230c62b0000000000ffffffffc5c8a53f42d60311e2dd44b77fb61e9a691dc9a01736840d0f1ddc8a9e0c12420100000000ffffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000005f5e100036a2e218bb512a3e65c80b59fec57aee428b7512276bcfa366c154dd7262994c817a914363273e2f851bda01e24cda41ba748b8d1f54cfe870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000007be00000125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000000bebba420230646d493a7ed8cb0091ad6e8feedcc9cd17a9162e61b7cff7929697792ef64217a91497dfc3937ad66e142925a76489eebc75358bca338700000000";
  // static const std::string kExpTxData = "0200000000027597a9db0a03074238e42936095b26e08193c5b054daf8d76bab761e0230c62b0000000000ffffffffc5c8a53f42d60311e2dd44b77fb61e9a691dc9a01736840d0f1ddc8a9e0c12420100000000ffffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000005f5e100036a2e218bb512a3e65c80b59fec57aee428b7512276bcfa366c154dd7262994c817a914363273e2f851bda01e24cda41ba748b8d1f54cfe870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000007ae00000125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000000bebba520230646d493a7ed8cb0091ad6e8feedcc9cd17a9162e61b7cff7929697792ef64217a91497dfc3937ad66e142925a76489eebc75358bca338700000000";

  CfdInitialize();
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  try {
    const char* tx = "020000000000010125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000005f5e100036a2e218bb512a3e65c80b59fec57aee428b7512276bcfa366c154dd7262994c817a914363273e2f851bda01e24cda41ba748b8d1f54cfe8700000000";
    uint32_t target_asset_count = 1;
    auto fee_asset = exp_dummy_asset_a.GetHex();
    void* fund_handle = nullptr;
    ret = CfdInitializeFundRawTx(
        handle, kCfdNetworkElementsRegtest, target_asset_count,
        fee_asset.c_str(), &fund_handle);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_NE(nullptr, fund_handle);
    if (ret == kCfdSuccess) {
      for (const auto& test_data : kFundCoinSelectElementsTestVector3) {
        ret = CfdAddUtxoForFundRawTx(
            handle, fund_handle,
            test_data.txid.c_str(), test_data.vout,
            test_data.amount,
            test_data.descriptor.c_str(),
            test_data.asset.c_str());
        EXPECT_EQ(kCfdSuccess, ret);
      }

      ret = CfdAddTargetAmountForFundRawTx(handle, fund_handle, 0, 100000000,
          exp_dummy_asset_a.GetHex().c_str(),
          "AzpkHG7iBPzGn3wCoKwEUrNMWA8TCLXTvhK6ftgAmaAGWqDKyDipYSFjsBBcGXKj3Y65Kt9UauCEbftj");
      EXPECT_EQ(kCfdSuccess, ret);

      ret = CfdSetOptionFundRawTx(handle, fund_handle, kCfdFundTxIsBlind,
          0, 0, true);
      EXPECT_EQ(kCfdSuccess, ret);
      ret = CfdSetOptionFundRawTx(handle, fund_handle, kCfdFundTxIsBlind,
          0, 0, true);
      EXPECT_EQ(kCfdSuccess, ret);

      int64_t tx_fee_amount = 0;
      uint32_t append_txout_count = 0;
      char* output_tx_hex = nullptr;
      double effective_fee_rate = 1.0;
      ret = CfdFinalizeFundRawTx(handle, fund_handle, tx,
          effective_fee_rate, &tx_fee_amount, &append_txout_count,
          &output_tx_hex);
      EXPECT_EQ(kCfdSuccess, ret);
      if (ret == kCfdSuccess) {
        EXPECT_EQ(1982, tx_fee_amount);
        // EXPECT_EQ(1966, tx_fee_amount);
        EXPECT_EQ(1, append_txout_count);
        EXPECT_STREQ(kExpTxData.c_str(), output_tx_hex);
        CfdFreeStringBuffer(output_tx_hex);
      } else {
        ret = CfdGetLastErrorCode(handle);
        if (ret != kCfdSuccess) {
          char* str_buffer = NULL;
          ret = CfdGetLastErrorMessage(handle, &str_buffer);
          EXPECT_EQ(kCfdSuccess, ret);
          EXPECT_STREQ("", str_buffer);
          CfdFreeStringBuffer(str_buffer);
          str_buffer = NULL;
        }
      }
    }
    ret = CfdFreeFundRawTxHandle(handle, fund_handle);
    EXPECT_EQ(kCfdSuccess, ret);

    // EXPECT_STREQ("", context.GetHex().c_str());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}